

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>
     *this,int i)

{
  Fad<double> *pFVar1;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  *pFVar2;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar4;
  double *pdVar5;
  value_type vVar6;
  
  vVar6 = FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
          ::dx(&this->left_->fadexpr_,i);
  pFVar1 = this->right_;
  pdVar5 = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    pdVar5 = (pFVar1->dx_).ptr_to_data + i;
  }
  pFVar2 = (this->left_->fadexpr_).right_;
  pFVar3 = (pFVar2->fadexpr_).left_;
  pFVar4 = (pFVar2->fadexpr_).right_;
  return vVar6 * pFVar1->val_ +
         (((pFVar3->fadexpr_).left_)->val_ * ((pFVar3->fadexpr_).right_)->val_ -
         ((pFVar4->fadexpr_).left_)->val_ * ((pFVar4->fadexpr_).right_)->val_) *
         ((this->left_->fadexpr_).left_)->val_ * *pdVar5;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}